

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_serializer.cxx
# Opt level: O0

void __thiscall nuraft::buffer_serializer::get_buffer(buffer_serializer *this,ptr<buffer> *dst)

{
  element_type *peVar1;
  size_t len_00;
  size_t sVar2;
  void *__src;
  byte *__dest;
  void *ptr;
  size_t len;
  buffer_serializer *in_stack_ffffffffffffffe0;
  
  peVar1 = std::__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x168422);
  len_00 = buffer::size(peVar1);
  peVar1 = std::__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x168439);
  sVar2 = buffer::pos(peVar1);
  __src = get_raw(in_stack_ffffffffffffffe0,len_00);
  peVar1 = std::__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x16846f);
  __dest = buffer::data(peVar1);
  memcpy(__dest,__src,len_00 - sVar2);
  return;
}

Assistant:

void buffer_serializer::get_buffer(ptr<buffer>& dst) {
    size_t len = dst->size() - dst->pos();
    void* ptr = get_raw(len);
    ::memcpy(dst->data(), ptr, len);
}